

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  stbi_uc sVar1;
  int iVar2;
  char c;
  long lVar3;
  
  lVar3 = 0;
  do {
    sVar1 = stbi__get8(z);
    iVar2 = stbi__at_eof(z);
    if ((iVar2 != 0) || (sVar1 == '\n')) goto LAB_00171bd1;
    buffer[lVar3] = sVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x3ff);
  lVar3 = 0x3ff;
  do {
    iVar2 = stbi__at_eof(z);
    if (iVar2 != 0) break;
    sVar1 = stbi__get8(z);
  } while (sVar1 != '\n');
LAB_00171bd1:
  buffer[lVar3] = '\0';
  return buffer;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}